

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void xmlSchemaPIllegalAttrErr
               (xmlSchemaParserCtxtPtr ctxt,xmlParserErrors error,xmlSchemaBasicItemPtr ownerComp,
               xmlAttrPtr attr)

{
  xmlChar *str1;
  xmlChar *localName;
  undefined4 in_register_00000034;
  xmlNodePtr node;
  xmlChar *strB;
  xmlChar *strA;
  xmlChar *local_28;
  xmlChar *local_20;
  
  node = (xmlNodePtr)CONCAT44(in_register_00000034,error);
  local_20 = (xmlChar *)0x0;
  local_28 = (xmlChar *)0x0;
  xmlSchemaFormatNodeForError(&local_20,(xmlSchemaAbstractCtxtPtr)ctxt,node->parent);
  str1 = local_20;
  localName = node->name;
  if (node->ns == (xmlNs *)0x0) {
    if (localName == (xmlChar *)0x0) {
      localName = xmlStrcat(local_28,(xmlChar *)"(NULL)");
      local_28 = localName;
    }
  }
  else {
    localName = xmlSchemaFormatQName(&local_28,node->ns->href,localName);
  }
  xmlSchemaErr4Line((xmlSchemaAbstractCtxtPtr)ctxt,XML_ERR_ERROR,0xbdb,node,0,
                    "%sThe attribute \'%s\' is not allowed.\n",str1,localName,(xmlChar *)0x0,
                    (xmlChar *)0x0);
  if (local_20 != (xmlChar *)0x0) {
    (*xmlFree)(local_20);
    local_20 = (xmlChar *)0x0;
  }
  if (local_28 != (xmlChar *)0x0) {
    (*xmlFree)(local_28);
  }
  return;
}

Assistant:

static void
xmlSchemaPIllegalAttrErr(xmlSchemaParserCtxtPtr ctxt,
			 xmlParserErrors error,
			 xmlSchemaBasicItemPtr ownerComp ATTRIBUTE_UNUSED,
			 xmlAttrPtr attr)
{
    xmlChar *strA = NULL, *strB = NULL;

    xmlSchemaFormatNodeForError(&strA, ACTXT_CAST ctxt, attr->parent);
    xmlSchemaErr4(ACTXT_CAST ctxt, error, (xmlNodePtr) attr,
	"%sThe attribute '%s' is not allowed.\n", BAD_CAST strA,
	xmlSchemaFormatQNameNs(&strB, attr->ns, attr->name),
	NULL, NULL);
    FREE_AND_NULL(strA);
    FREE_AND_NULL(strB);
}